

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
EfcFlash::getLockRegions(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,EfcFlash *this)

{
  uint uVar1;
  uint32_t uVar2;
  _Bit_type *p_Var3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  _Bit_type _Var9;
  allocator_type local_1a;
  bool local_19;
  
  local_19 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(ulong)(this->super_Flash)._lockRegions,&local_19,&local_1a);
  uVar4 = Samba::readWord((this->super_Flash)._samba,0xffffff68);
  uVar5 = 0;
  if ((this->super_Flash)._planes == 2) {
    uVar5 = Samba::readWord((this->super_Flash)._samba,0xffffff78);
  }
  uVar1 = (this->super_Flash)._lockRegions;
  if (uVar1 != 0) {
    uVar2 = (this->super_Flash)._planes;
    p_Var3 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar6 = 0;
    do {
      uVar7 = uVar6 >> 6;
      uVar8 = 1L << ((byte)uVar6 & 0x3f);
      if (uVar6 < uVar1 >> 1 || uVar2 != 2) {
        if ((uVar4 >> (uVar6 + 0x10 & 0x1f) & 1) == 0) goto LAB_0010ed1d;
LAB_0010ed30:
        _Var9 = uVar8 | p_Var3[uVar7];
      }
      else {
        if ((uVar5 >> ((0x10 - (uVar1 >> 1)) + uVar6 & 0x1f) & 1) != 0) goto LAB_0010ed30;
LAB_0010ed1d:
        _Var9 = ~uVar8 & p_Var3[uVar7];
      }
      p_Var3[uVar7] = _Var9;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
EfcFlash::getLockRegions()
{
    std::vector<bool> regions(_lockRegions);
    uint32_t fsr0;
    uint32_t fsr1;

    fsr0 = readFSR0();
    if (_planes == 2)
        fsr1 = readFSR1();
    else
        fsr1 = 0;

    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (_planes == 2 && region >= _lockRegions / 2)
            regions[region] = (fsr1 & (1 << (16 + region - _lockRegions / 2))) != 0;
        else
            regions[region] = (fsr0 & (1 << (16 + region))) != 0;
    }

    return regions;
}